

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
* toml::detail::parse_comment_line<toml::type_config>
            (result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
             *__return_storage_ptr__,location *loc,context<toml::type_config> *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  element_type *peVar3;
  _Head_base<0UL,_toml::detail::scanner_base_*,_false> _Var4;
  long lVar5;
  pointer puVar6;
  ulong uVar7;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RDX;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RDX_00;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *v;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RDX_01;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RDX_02;
  ulong uVar8;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RDX_03;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *v_00;
  ulong uVar9;
  scanner_storage *other;
  pointer psVar10;
  size_t sVar11;
  size_t sVar12;
  char (*in_R9) [65];
  uchar *puVar13;
  bool bVar14;
  location first;
  region com_reg;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_388;
  bool local_368;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_360;
  bool local_340;
  error_info local_338;
  undefined1 local_2e0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  undefined1 local_2a0 [32];
  undefined1 local_280 [24];
  size_type sStack_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260 [4];
  undefined1 local_218 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8 [4];
  location local_1b0;
  region local_168;
  source_location local_100;
  failure<toml::error_info> local_88;
  
  location::location(&local_1b0,loc);
  skip_whitespace<toml::type_config>(loc,ctx);
  syntax::comment((sequence *)local_218,&ctx->toml_spec_);
  sequence::scan(&local_168,(sequence *)local_218,loc);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *)
          (local_218 + 8));
  if (local_168.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    (loc->source_).
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = local_1b0.source_.
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(loc->source_).
                super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,
               &local_1b0.source_.
                super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&loc->source_name_,&local_1b0.source_name_);
    loc->column_number_ = local_1b0.column_number_;
    loc->location_ = local_1b0.location_;
    loc->line_number_ = local_1b0.line_number_;
    local_1f8[0]._M_local_buf[0] = '\0';
    ok<std::optional<std::__cxx11::string>>
              ((success<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_388,(toml *)local_218,v);
    __return_storage_ptr__->is_ok_ = true;
    *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0;
    if (local_368 == true) {
      paVar1 = &(__return_storage_ptr__->field_1).fail_.value.title_.field_2;
      *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)&__return_storage_ptr__->field_1 = paVar1;
      if (local_388._M_value._M_dataplus._M_p == (_Alloc_hider)((long)&local_388._M_value + 0x10)) {
        paVar1->_M_allocated_capacity = CONCAT71(local_388._17_7_,local_388._16_1_);
        *(undefined8 *)((long)&(__return_storage_ptr__->field_1).fail_.value.title_.field_2 + 8) =
             local_388._24_8_;
      }
      else {
        (__return_storage_ptr__->field_1).fail_.value.title_._M_dataplus._M_p =
             (pointer)local_388._M_value._M_dataplus._M_p;
        (__return_storage_ptr__->field_1).fail_.value.title_.field_2._M_allocated_capacity =
             CONCAT71(local_388._17_7_,local_388._16_1_);
      }
      (__return_storage_ptr__->field_1).fail_.value.title_._M_string_length =
           local_388._M_value._M_string_length;
      local_388._M_value._M_string_length = 0;
      local_388._16_1_ = 0;
      *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 1;
      local_368 = false;
      local_388._M_value._M_dataplus._M_p = (_Alloc_hider)((long)&local_388._M_value + 0x10);
    }
    if ((local_1f8[0]._M_local_buf[0] != '\x01') ||
       (local_1f8[0]._M_local_buf[0] = '\0',
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_218._0_8_ == &local_208)) goto LAB_00362f20;
  }
  else {
    peVar3 = (loc->source_).
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    last._M_current = (uchar *)loc->location_;
    puVar13 = (peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish +
              -(long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start;
    if (last._M_current < puVar13) {
      local_338.title_._M_dataplus._M_p = (pointer)&PTR__scanner_base_004e0828;
      local_338.title_._M_string_length = CONCAT71(local_338.title_._M_string_length._1_7_,10);
      local_280._0_8_ = &PTR__scanner_base_004e0940;
      local_280._8_8_ = "\r\n";
      local_280._16_8_ = (pointer)0x2;
      either::either<toml::detail::character,toml::detail::literal>
                ((either *)local_2a0,(character *)&local_338,(literal *)local_280);
      bVar14 = local_2a0._8_8_ == local_2a0._16_8_;
      if (!bVar14) {
        psVar10 = (pointer)local_2a0._8_8_;
        do {
          _Var4._M_head_impl =
               (psVar10->scanner_)._M_t.
               super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
               ._M_t.
               super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
               .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl;
          (*(_Var4._M_head_impl)->_vptr_scanner_base[2])((region *)local_218,_Var4._M_head_impl,loc)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            v_00 = extraout_RDX_00;
            if (!bVar14) goto LAB_00362a84;
            break;
          }
          region::~region((region *)local_218);
          psVar10 = psVar10 + 1;
          bVar14 = psVar10 == (pointer)local_2a0._16_8_;
        } while (!bVar14);
      }
      region::region((region *)local_218);
      v_00 = extraout_RDX_01;
LAB_00362a84:
      bVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_218._0_8_ ==
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
    }
    else {
      bVar14 = false;
      v_00 = extraout_RDX;
    }
    if (last._M_current < puVar13) {
      region::~region((region *)local_218);
      std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
      ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
               *)(local_2a0 + 8));
      v_00 = extraout_RDX_02;
    }
    if (bVar14) {
      peVar3 = (loc->source_).
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      lVar5 = (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start;
      uVar7 = (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish - lVar5;
      if (loc->location_ < uVar7) {
        sVar11 = loc->line_number_;
        sVar12 = loc->column_number_;
        uVar8 = loc->location_;
LAB_00362ae2:
        if (uVar8 + 1 < uVar7) {
          if (*(char *)(lVar5 + uVar8) == '\n') {
            sVar11 = sVar11 + 1;
            loc->line_number_ = sVar11;
            sVar12 = 1;
          }
          else {
            sVar12 = sVar12 + 1;
          }
          loc->column_number_ = sVar12;
          uVar9 = uVar8 + 1;
        }
        else {
          for (; uVar9 = uVar7, uVar7 != uVar8; uVar8 = uVar8 + 1) {
            if (*(char *)(lVar5 + uVar8) == '\n') {
              sVar11 = sVar11 + 1;
              loc->line_number_ = sVar11;
              sVar12 = 1;
            }
            else {
              sVar12 = sVar12 + 1;
            }
            loc->column_number_ = sVar12;
          }
        }
        loc->location_ = uVar9;
        if ((uVar7 <= uVar9) || (*(char *)(lVar5 + uVar9) != '\n')) goto LAB_00362b46;
        if (uVar9 + 1 < uVar7) {
          if (*(char *)(lVar5 + uVar9) == '\n') {
            loc->line_number_ = loc->line_number_ + 1;
            sVar11 = 1;
          }
          else {
            sVar11 = loc->column_number_ + 1;
          }
          loc->column_number_ = sVar11;
          uVar7 = uVar9 + 1;
        }
        else if (uVar7 != uVar9) {
          sVar11 = loc->line_number_;
          sVar12 = loc->column_number_;
          do {
            if (*(char *)(lVar5 + uVar9) == '\n') {
              sVar11 = sVar11 + 1;
              loc->line_number_ = sVar11;
              sVar12 = 1;
            }
            else {
              sVar12 = sVar12 + 1;
            }
            loc->column_number_ = sVar12;
            uVar9 = uVar9 + 1;
          } while (uVar7 != uVar9);
        }
        loc->location_ = uVar7;
      }
LAB_00362db3:
      local_2c0 = &local_2b0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2c0,
                 "toml::parse_comment_line: newline (LF / CRLF) or EOF is expected","");
      region::region((region *)local_280,loc);
      source_location::source_location(&local_100,(region *)local_280);
      local_2e0._0_8_ = local_2e0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"but got this","");
      make_error_info<char_const(&)[65]>
                (&local_338,(toml *)&local_2c0,(string *)&local_100,(source_location *)local_2e0,
                 (string *)"Hint: most of the control characters are not allowed in comments",in_R9)
      ;
      err<toml::error_info>(&local_88,&local_338);
      __return_storage_ptr__->is_ok_ = false;
      failure<toml::error_info>::failure
                ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_88);
      failure<toml::error_info>::~failure(&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338.suffix_._M_dataplus._M_p != &local_338.suffix_.field_2) {
        operator_delete(local_338.suffix_._M_dataplus._M_p,
                        local_338.suffix_.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_338.locations_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338.title_._M_dataplus._M_p != &local_338.title_.field_2) {
        operator_delete(local_338.title_._M_dataplus._M_p,
                        CONCAT71(local_338.title_.field_2._M_allocated_capacity._1_7_,
                                 local_338.title_.field_2._M_local_buf[0]) + 1);
      }
      if ((undefined1 *)local_2e0._0_8_ != local_2e0 + 0x10) {
        operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
      }
      source_location::~source_location(&local_100);
      region::~region((region *)local_280);
      local_208._M_allocated_capacity = local_2b0._M_allocated_capacity;
      local_218._0_8_ = local_2c0;
      if (local_2c0 == &local_2b0) goto LAB_00362f20;
    }
    else {
      paVar1 = &local_338.title_.field_2;
      if (local_168.source_.
          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr == (element_type *)0x0) {
        local_338.title_._M_string_length = 0;
        local_338.title_.field_2._M_local_buf[0] = '\0';
        local_338.title_._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        puVar6 = ((local_168.source_.
                   super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        make_string<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (&local_338.title_,(detail *)(puVar6 + local_168.first_),
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(puVar6 + local_168.last_),last);
        v_00 = extraout_RDX_03;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338.title_._M_dataplus._M_p == paVar1) {
        sStack_268 = local_338.title_.field_2._8_8_;
        local_280._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_280 + 0x10);
      }
      else {
        local_280._0_8_ = local_338.title_._M_dataplus._M_p;
      }
      local_280._17_7_ = local_338.title_.field_2._M_allocated_capacity._1_7_;
      local_280[0x10] = local_338.title_.field_2._M_local_buf[0];
      local_280._8_8_ = local_338.title_._M_string_length;
      local_338.title_._M_string_length = 0;
      local_338.title_.field_2._M_local_buf[0] = '\0';
      local_260[0]._M_local_buf[0] = '\x01';
      local_338.title_._M_dataplus._M_p = (pointer)paVar1;
      ok<std::optional<std::__cxx11::string>>
                ((success<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_360,(toml *)local_280,v_00);
      __return_storage_ptr__->is_ok_ = true;
      *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0;
      if (local_340 == true) {
        paVar2 = &(__return_storage_ptr__->field_1).fail_.value.title_.field_2;
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)&__return_storage_ptr__->field_1 = paVar2;
        if (local_360._M_value._M_dataplus._M_p == (_Alloc_hider)((long)&local_360._M_value + 0x10))
        {
          paVar2->_M_allocated_capacity = CONCAT71(local_360._17_7_,local_360._16_1_);
          *(undefined8 *)((long)&(__return_storage_ptr__->field_1).fail_.value.title_.field_2 + 8) =
               local_360._24_8_;
        }
        else {
          (__return_storage_ptr__->field_1).fail_.value.title_._M_dataplus._M_p =
               (pointer)local_360._M_value._M_dataplus._M_p;
          (__return_storage_ptr__->field_1).fail_.value.title_.field_2._M_allocated_capacity =
               CONCAT71(local_360._17_7_,local_360._16_1_);
        }
        (__return_storage_ptr__->field_1).fail_.value.title_._M_string_length =
             local_360._M_value._M_string_length;
        local_360._M_value._M_string_length = 0;
        local_360._16_1_ = 0;
        *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 1;
        local_340 = false;
        local_360._M_value._M_dataplus._M_p = (_Alloc_hider)((long)&local_360._M_value + 0x10);
      }
      if ((local_260[0]._M_local_buf[0] == '\x01') &&
         (local_260[0]._M_local_buf[0] = '\0',
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_280._0_8_ !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_280 + 0x10))) {
        operator_delete((void *)local_280._0_8_,(ulong)(local_280._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338.title_._M_dataplus._M_p == paVar1) goto LAB_00362f20;
      local_208._M_allocated_capacity =
           CONCAT71(local_338.title_.field_2._M_allocated_capacity._1_7_,
                    local_338.title_.field_2._M_local_buf[0]);
      local_218._0_8_ = local_338.title_._M_dataplus._M_p;
    }
  }
  operator_delete((void *)local_218._0_8_,
                  (ulong)((long)&(((pointer)local_208._M_allocated_capacity)->scanner_)._M_t.
                                 super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                                 .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>.
                                 _M_head_impl + 1));
LAB_00362f20:
  region::~region(&local_168);
  location::~location(&local_1b0);
  return __return_storage_ptr__;
LAB_00362b46:
  uVar8 = uVar9;
  if (uVar7 <= uVar9) goto LAB_00362db3;
  goto LAB_00362ae2;
}

Assistant:

result<cxx::optional<std::string>, error_info>
parse_comment_line(location& loc, context<TC>& ctx)
{
    const auto& spec = ctx.toml_spec();
    const auto first = loc;

    skip_whitespace(loc, ctx);

    const auto com_reg = syntax::comment(spec).scan(loc);
    if(com_reg.is_ok())
    {
        // once comment started, newline must follow (or reach EOF).
        if( ! loc.eof() && ! syntax::newline(spec).scan(loc).is_ok())
        {
            while( ! loc.eof()) // skip until newline to continue parsing
            {
                loc.advance();
                if(loc.current() == '\n') { /*skip LF*/ loc.advance(); break; }
            }
            return err(make_error_info("toml::parse_comment_line: "
                "newline (LF / CRLF) or EOF is expected",
                source_location(region(loc)), "but got this",
                "Hint: most of the control characters are not allowed in comments"));
        }
        return ok(cxx::optional<std::string>(com_reg.as_string()));
    }
    else
    {
        loc = first; // rollback whitespace to parse indent
        return ok(cxx::optional<std::string>(cxx::make_nullopt()));
    }
}